

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O1

int secp256k1_ge_is_valid_var(secp256k1_ge *a)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  int iVar150;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  ulong uVar151;
  ulong uVar152;
  secp256k1_ge *a_00;
  ulong uVar153;
  ulong uVar154;
  ulong uVar155;
  secp256k1_fe *a_01;
  ulong uVar156;
  secp256k1_ge *in_RSI;
  secp256k1_ge *a_02;
  secp256k1_ge *psVar157;
  secp256k1_ge *psVar158;
  secp256k1_ge *psVar159;
  secp256k1_ge *a_03;
  ulong uVar160;
  ulong unaff_R12;
  ulong unaff_R13;
  ulong unaff_R14;
  undefined8 unaff_R15;
  uint64_t tmp3;
  uint64_t tmp2;
  uint64_t tmp3_1;
  secp256k1_fe x3;
  secp256k1_fe y2;
  undefined1 auStack_170 [56];
  uint64_t uStack_138;
  uint64_t uStack_130;
  uint64_t uStack_128;
  uint64_t uStack_120;
  undefined8 uStack_118;
  int iStack_114;
  secp256k1_ge *psStack_108;
  code *pcStack_100;
  ulong uStack_f8;
  ulong uStack_f0;
  ulong uStack_e8;
  secp256k1_ge *psStack_e0;
  ulong uStack_d8;
  ulong uStack_d0;
  ulong uStack_c8;
  undefined8 uStack_c0;
  secp256k1_ge *psStack_b8;
  secp256k1_fe *psStack_b0;
  ulong local_a8;
  secp256k1_ge *local_a0;
  ulong local_98;
  secp256k1_fe local_90;
  secp256k1_fe local_60;
  
  psStack_b0 = (secp256k1_fe *)0x145204;
  secp256k1_ge_verify(a);
  if (a->infinity != 0) {
    return 0;
  }
  a_01 = &a->y;
  psStack_b0 = (secp256k1_fe *)0x14521c;
  psVar158 = (secp256k1_ge *)a_01;
  secp256k1_fe_verify(a_01);
  if ((a->y).magnitude < 9) {
    uVar155 = a_01->n[0];
    uVar160 = (a->y).n[1];
    unaff_R12 = (a->y).n[2];
    unaff_R13 = (a->y).n[3];
    uVar154 = (a->y).n[4];
    unaff_R15 = 0xfffffffffffff;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar155 * 2;
    auVar71._8_8_ = 0;
    auVar71._0_8_ = unaff_R13;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar160 * 2;
    auVar72._8_8_ = 0;
    auVar72._0_8_ = unaff_R12;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar154;
    auVar73._8_8_ = 0;
    auVar73._0_8_ = uVar154;
    uVar151 = SUB168(auVar3 * auVar73,0);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar151 & 0xfffffffffffff;
    auVar1 = auVar2 * auVar72 + auVar1 * auVar71 + auVar4 * ZEXT816(0x1000003d10);
    uVar153 = auVar1._0_8_;
    local_90.n[0] = uVar153 & 0xfffffffffffff;
    auVar129._8_8_ = 0;
    auVar129._0_8_ = uVar153 >> 0x34 | auVar1._8_8_ << 0xc;
    unaff_R14 = uVar154 * 2;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = uVar155;
    auVar74._8_8_ = 0;
    auVar74._0_8_ = unaff_R14;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = uVar160 * 2;
    auVar75._8_8_ = 0;
    auVar75._0_8_ = unaff_R13;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = unaff_R12;
    auVar76._8_8_ = 0;
    auVar76._0_8_ = unaff_R12;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = uVar151 >> 0x34 | SUB168(auVar3 * auVar73,8) << 0xc;
    auVar1 = auVar5 * auVar74 + auVar129 + auVar6 * auVar75 + auVar7 * auVar76 +
             auVar8 * ZEXT816(0x1000003d10);
    uVar154 = auVar1._0_8_;
    auVar130._8_8_ = 0;
    auVar130._0_8_ = uVar154 >> 0x34 | auVar1._8_8_ << 0xc;
    local_a8 = (uVar154 & 0xfffffffffffff) >> 0x30;
    in_RSI = (secp256k1_ge *)(uVar154 & 0xffffffffffff);
    auVar9._8_8_ = 0;
    auVar9._0_8_ = uVar155;
    auVar77._8_8_ = 0;
    auVar77._0_8_ = uVar155;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = uVar160;
    auVar78._8_8_ = 0;
    auVar78._0_8_ = unaff_R14;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = unaff_R12 * 2;
    auVar79._8_8_ = 0;
    auVar79._0_8_ = unaff_R13;
    auVar1 = auVar10 * auVar78 + auVar130 + auVar11 * auVar79;
    uVar154 = auVar1._0_8_;
    auVar132._8_8_ = 0;
    auVar132._0_8_ = uVar154 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar80._8_8_ = 0;
    auVar80._0_8_ = (uVar154 & 0xfffffffffffff) << 4 | local_a8;
    auVar1 = auVar9 * auVar77 + ZEXT816(0x1000003d1) * auVar80;
    uVar154 = auVar1._0_8_;
    local_60.n[0] = uVar154 & 0xfffffffffffff;
    auVar131._8_8_ = 0;
    auVar131._0_8_ = uVar154 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar12._8_8_ = 0;
    auVar12._0_8_ = uVar155 * 2;
    auVar81._8_8_ = 0;
    auVar81._0_8_ = uVar160;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = unaff_R12;
    auVar82._8_8_ = 0;
    auVar82._0_8_ = unaff_R14;
    auVar14._8_8_ = 0;
    auVar14._0_8_ = unaff_R13;
    auVar83._8_8_ = 0;
    auVar83._0_8_ = unaff_R13;
    auVar2 = auVar13 * auVar82 + auVar132 + auVar14 * auVar83;
    uVar154 = auVar2._0_8_;
    auVar15._8_8_ = 0;
    auVar15._0_8_ = uVar154 & 0xfffffffffffff;
    auVar1 = auVar12 * auVar81 + auVar131 + auVar15 * ZEXT816(0x1000003d10);
    uVar151 = auVar1._0_8_;
    auVar134._8_8_ = 0;
    auVar134._0_8_ = uVar154 >> 0x34 | auVar2._8_8_ << 0xc;
    local_60.n[1] = uVar151 & 0xfffffffffffff;
    auVar133._8_8_ = 0;
    auVar133._0_8_ = uVar151 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = uVar155 * 2;
    auVar84._8_8_ = 0;
    auVar84._0_8_ = unaff_R12;
    auVar17._8_8_ = 0;
    auVar17._0_8_ = uVar160;
    auVar85._8_8_ = 0;
    auVar85._0_8_ = uVar160;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = unaff_R13;
    auVar86._8_8_ = 0;
    auVar86._0_8_ = unaff_R14;
    auVar134 = auVar18 * auVar86 + auVar134;
    uVar155 = auVar134._0_8_;
    auVar19._8_8_ = 0;
    auVar19._0_8_ = uVar155 & 0xfffffffffffff;
    auVar1 = auVar16 * auVar84 + auVar133 + auVar17 * auVar85 + auVar19 * ZEXT816(0x1000003d10);
    uVar160 = auVar1._0_8_;
    a_01 = (secp256k1_fe *)(uVar155 >> 0x34 | auVar134._8_8_ << 0xc);
    local_60.n[2] = uVar160 & 0xfffffffffffff;
    auVar135._8_8_ = 0;
    auVar135._0_8_ = (uVar160 >> 0x34 | auVar1._8_8_ << 0xc) + local_90.n[0];
    auVar20._8_8_ = 0;
    auVar20._0_8_ = a_01;
    auVar135 = auVar20 * ZEXT816(0x1000003d10) + auVar135;
    uVar155 = auVar135._0_8_;
    local_60.n[3] = uVar155 & 0xfffffffffffff;
    local_60.n[4] = (long)(in_RSI->x).n + (uVar155 >> 0x34 | auVar135._8_8_ << 0xc);
    local_60.magnitude = 1;
    local_60.normalized = 0;
    psStack_b0 = (secp256k1_fe *)0x14545e;
    local_a0 = in_RSI;
    secp256k1_fe_verify(&local_60);
    psStack_b0 = (secp256k1_fe *)0x145466;
    psVar158 = a;
    secp256k1_fe_verify(&a->x);
    if ((a->x).magnitude < 9) {
      uVar155 = (a->x).n[0];
      uVar160 = (a->x).n[1];
      uVar154 = (a->x).n[2];
      uVar151 = (a->x).n[3];
      uVar153 = (a->x).n[4];
      auVar21._8_8_ = 0;
      auVar21._0_8_ = uVar155 * 2;
      auVar87._8_8_ = 0;
      auVar87._0_8_ = uVar151;
      auVar22._8_8_ = 0;
      auVar22._0_8_ = uVar160 * 2;
      auVar88._8_8_ = 0;
      auVar88._0_8_ = uVar154;
      auVar23._8_8_ = 0;
      auVar23._0_8_ = uVar153;
      auVar89._8_8_ = 0;
      auVar89._0_8_ = uVar153;
      uVar152 = SUB168(auVar23 * auVar89,0);
      auVar24._8_8_ = 0;
      auVar24._0_8_ = uVar152 & 0xfffffffffffff;
      auVar1 = auVar22 * auVar88 + auVar21 * auVar87 + auVar24 * ZEXT816(0x1000003d10);
      uVar156 = auVar1._0_8_;
      local_a0 = (secp256k1_ge *)(uVar156 & 0xfffffffffffff);
      auVar136._8_8_ = 0;
      auVar136._0_8_ = uVar156 >> 0x34 | auVar1._8_8_ << 0xc;
      uVar153 = uVar153 * 2;
      auVar25._8_8_ = 0;
      auVar25._0_8_ = uVar155;
      auVar90._8_8_ = 0;
      auVar90._0_8_ = uVar153;
      auVar26._8_8_ = 0;
      auVar26._0_8_ = uVar160 * 2;
      auVar91._8_8_ = 0;
      auVar91._0_8_ = uVar151;
      auVar27._8_8_ = 0;
      auVar27._0_8_ = uVar154;
      auVar92._8_8_ = 0;
      auVar92._0_8_ = uVar154;
      auVar28._8_8_ = 0;
      auVar28._0_8_ = uVar152 >> 0x34 | SUB168(auVar23 * auVar89,8) << 0xc;
      auVar1 = auVar25 * auVar90 + auVar136 + auVar26 * auVar91 + auVar27 * auVar92 +
               auVar28 * ZEXT816(0x1000003d10);
      local_a8 = auVar1._0_8_;
      auVar137._8_8_ = 0;
      auVar137._0_8_ = local_a8 >> 0x34 | auVar1._8_8_ << 0xc;
      local_98 = (local_a8 & 0xfffffffffffff) >> 0x30;
      local_a8 = local_a8 & 0xffffffffffff;
      auVar29._8_8_ = 0;
      auVar29._0_8_ = uVar155;
      auVar93._8_8_ = 0;
      auVar93._0_8_ = uVar155;
      auVar30._8_8_ = 0;
      auVar30._0_8_ = uVar160;
      auVar94._8_8_ = 0;
      auVar94._0_8_ = uVar153;
      auVar31._8_8_ = 0;
      auVar31._0_8_ = uVar154 * 2;
      auVar95._8_8_ = 0;
      auVar95._0_8_ = uVar151;
      auVar1 = auVar30 * auVar94 + auVar137 + auVar31 * auVar95;
      uVar152 = auVar1._0_8_;
      auVar139._8_8_ = 0;
      auVar139._0_8_ = uVar152 >> 0x34 | auVar1._8_8_ << 0xc;
      auVar96._8_8_ = 0;
      auVar96._0_8_ = (uVar152 & 0xfffffffffffff) << 4 | local_98;
      auVar1 = auVar29 * auVar93 + ZEXT816(0x1000003d1) * auVar96;
      uVar152 = auVar1._0_8_;
      local_90.n[0] = uVar152 & 0xfffffffffffff;
      auVar138._8_8_ = 0;
      auVar138._0_8_ = uVar152 >> 0x34 | auVar1._8_8_ << 0xc;
      auVar32._8_8_ = 0;
      auVar32._0_8_ = uVar155 * 2;
      auVar97._8_8_ = 0;
      auVar97._0_8_ = uVar160;
      auVar33._8_8_ = 0;
      auVar33._0_8_ = uVar154;
      auVar98._8_8_ = 0;
      auVar98._0_8_ = uVar153;
      auVar34._8_8_ = 0;
      auVar34._0_8_ = uVar151;
      auVar99._8_8_ = 0;
      auVar99._0_8_ = uVar151;
      auVar2 = auVar33 * auVar98 + auVar139 + auVar34 * auVar99;
      uVar152 = auVar2._0_8_;
      auVar35._8_8_ = 0;
      auVar35._0_8_ = uVar152 & 0xfffffffffffff;
      auVar1 = auVar32 * auVar97 + auVar138 + auVar35 * ZEXT816(0x1000003d10);
      uVar156 = auVar1._0_8_;
      auVar141._8_8_ = 0;
      auVar141._0_8_ = uVar152 >> 0x34 | auVar2._8_8_ << 0xc;
      local_90.n[1] = uVar156 & 0xfffffffffffff;
      auVar140._8_8_ = 0;
      auVar140._0_8_ = uVar156 >> 0x34 | auVar1._8_8_ << 0xc;
      auVar36._8_8_ = 0;
      auVar36._0_8_ = uVar155 * 2;
      auVar100._8_8_ = 0;
      auVar100._0_8_ = uVar154;
      auVar37._8_8_ = 0;
      auVar37._0_8_ = uVar160;
      auVar101._8_8_ = 0;
      auVar101._0_8_ = uVar160;
      auVar38._8_8_ = 0;
      auVar38._0_8_ = uVar151;
      auVar102._8_8_ = 0;
      auVar102._0_8_ = uVar153;
      auVar141 = auVar38 * auVar102 + auVar141;
      uVar155 = auVar141._0_8_;
      auVar39._8_8_ = 0;
      auVar39._0_8_ = uVar155 & 0xfffffffffffff;
      auVar1 = auVar36 * auVar100 + auVar140 + auVar37 * auVar101 + auVar39 * ZEXT816(0x1000003d10);
      uVar160 = auVar1._0_8_;
      local_90.n[2] = uVar160 & 0xfffffffffffff;
      auVar142._8_8_ = 0;
      auVar142._0_8_ = (uVar160 >> 0x34 | auVar1._8_8_ << 0xc) + (long)local_a0;
      auVar40._8_8_ = 0;
      auVar40._0_8_ = uVar155 >> 0x34 | auVar141._8_8_ << 0xc;
      auVar142 = auVar40 * ZEXT816(0x1000003d10) + auVar142;
      uVar155 = auVar142._0_8_;
      local_90.n[3] = uVar155 & 0xfffffffffffff;
      local_90.n[4] = (uVar155 >> 0x34 | auVar142._8_8_ << 0xc) + local_a8;
      local_90.magnitude = 1;
      local_90.normalized = 0;
      psStack_b0 = (secp256k1_fe *)0x1456ab;
      secp256k1_fe_verify(&local_90);
      psStack_b0 = (secp256k1_fe *)0x1456b9;
      secp256k1_fe_mul(&local_90,&local_90,&a->x);
      psStack_b0 = (secp256k1_fe *)0x1456c1;
      secp256k1_fe_verify(&local_90);
      local_90.n[0] = local_90.n[0] + 7;
      local_90.normalized = 0;
      local_90.magnitude = local_90.magnitude + 1;
      psStack_b0 = (secp256k1_fe *)0x1456d7;
      secp256k1_fe_verify(&local_90);
      psStack_b0 = (secp256k1_fe *)0x1456e4;
      iVar150 = secp256k1_fe_equal_var(&local_60,&local_90);
      return iVar150;
    }
  }
  else {
    psStack_b0 = (secp256k1_fe *)0x1456f8;
    secp256k1_ge_is_valid_var_cold_2();
  }
  psStack_b0 = (secp256k1_fe *)secp256k1_ge_verify;
  secp256k1_ge_is_valid_var_cold_1();
  psStack_b8 = (secp256k1_ge *)0x145706;
  psStack_b0 = a_01;
  secp256k1_fe_verify(&psVar158->x);
  psVar159 = (secp256k1_ge *)&psVar158->y;
  psStack_b8 = (secp256k1_ge *)0x14570f;
  secp256k1_fe_verify((secp256k1_fe *)psVar159);
  if ((uint)psVar158->infinity < 2) {
    return extraout_EAX;
  }
  psStack_b8 = (secp256k1_ge *)secp256k1_fe_mul;
  secp256k1_ge_verify_cold_1();
  pcStack_100 = (code *)0x14573b;
  a_02 = in_RSI;
  psStack_e0 = psVar158;
  uStack_d8 = unaff_R12;
  uStack_d0 = unaff_R13;
  uStack_c8 = unaff_R14;
  uStack_c0 = unaff_R15;
  psStack_b8 = a;
  secp256k1_fe_verify(&in_RSI->x);
  pcStack_100 = (code *)0x145743;
  psVar158 = a_00;
  secp256k1_fe_verify(&a_00->x);
  if ((in_RSI->x).magnitude < 9) {
    if (8 < (a_00->x).magnitude) goto LAB_00145a90;
    if (psVar159 == a_00) goto LAB_00145a95;
    if (in_RSI != a_00) {
      uVar155 = (in_RSI->x).n[0];
      uVar160 = (in_RSI->x).n[1];
      uVar154 = (in_RSI->x).n[2];
      uVar151 = (in_RSI->x).n[3];
      uVar153 = (in_RSI->x).n[4];
      auVar41._8_8_ = 0;
      auVar41._0_8_ = (a_00->x).n[0];
      auVar103._8_8_ = 0;
      auVar103._0_8_ = uVar151;
      auVar42._8_8_ = 0;
      auVar42._0_8_ = (a_00->x).n[1];
      auVar104._8_8_ = 0;
      auVar104._0_8_ = uVar154;
      auVar43._8_8_ = 0;
      auVar43._0_8_ = (a_00->x).n[2];
      auVar105._8_8_ = 0;
      auVar105._0_8_ = uVar160;
      auVar44._8_8_ = 0;
      auVar44._0_8_ = (a_00->x).n[3];
      auVar106._8_8_ = 0;
      auVar106._0_8_ = uVar155;
      auVar45._8_8_ = 0;
      auVar45._0_8_ = (a_00->x).n[4];
      auVar107._8_8_ = 0;
      auVar107._0_8_ = uVar153;
      uVar152 = SUB168(auVar45 * auVar107,0);
      auVar46._8_8_ = 0;
      auVar46._0_8_ = uVar152 & 0xfffffffffffff;
      auVar1 = auVar42 * auVar104 + auVar41 * auVar103 + auVar43 * auVar105 + auVar44 * auVar106 +
               auVar46 * ZEXT816(0x1000003d10);
      uVar156 = auVar1._0_8_;
      uStack_e8 = uVar156 & 0xfffffffffffff;
      auVar143._8_8_ = 0;
      auVar143._0_8_ = uVar156 >> 0x34 | auVar1._8_8_ << 0xc;
      auVar47._8_8_ = 0;
      auVar47._0_8_ = (a_00->x).n[0];
      auVar108._8_8_ = 0;
      auVar108._0_8_ = uVar153;
      auVar48._8_8_ = 0;
      auVar48._0_8_ = (a_00->x).n[1];
      auVar109._8_8_ = 0;
      auVar109._0_8_ = uVar151;
      auVar49._8_8_ = 0;
      auVar49._0_8_ = (a_00->x).n[2];
      auVar110._8_8_ = 0;
      auVar110._0_8_ = uVar154;
      auVar50._8_8_ = 0;
      auVar50._0_8_ = (a_00->x).n[3];
      auVar111._8_8_ = 0;
      auVar111._0_8_ = uVar160;
      auVar51._8_8_ = 0;
      auVar51._0_8_ = (a_00->x).n[4];
      auVar112._8_8_ = 0;
      auVar112._0_8_ = uVar155;
      auVar52._8_8_ = 0;
      auVar52._0_8_ = uVar152 >> 0x34 | SUB168(auVar45 * auVar107,8) << 0xc;
      auVar1 = auVar47 * auVar108 + auVar143 + auVar48 * auVar109 + auVar49 * auVar110 +
               auVar50 * auVar111 + auVar51 * auVar112 + auVar52 * ZEXT816(0x1000003d10);
      uStack_f0 = auVar1._0_8_;
      auVar144._8_8_ = 0;
      auVar144._0_8_ = uStack_f0 >> 0x34 | auVar1._8_8_ << 0xc;
      uStack_f8 = (uStack_f0 & 0xfffffffffffff) >> 0x30;
      uStack_f0 = uStack_f0 & 0xffffffffffff;
      auVar53._8_8_ = 0;
      auVar53._0_8_ = (a_00->x).n[0];
      auVar113._8_8_ = 0;
      auVar113._0_8_ = uVar155;
      auVar54._8_8_ = 0;
      auVar54._0_8_ = (a_00->x).n[1];
      auVar114._8_8_ = 0;
      auVar114._0_8_ = uVar153;
      auVar55._8_8_ = 0;
      auVar55._0_8_ = (a_00->x).n[2];
      auVar115._8_8_ = 0;
      auVar115._0_8_ = uVar151;
      auVar56._8_8_ = 0;
      auVar56._0_8_ = (a_00->x).n[3];
      auVar116._8_8_ = 0;
      auVar116._0_8_ = uVar154;
      auVar57._8_8_ = 0;
      auVar57._0_8_ = (a_00->x).n[4];
      auVar117._8_8_ = 0;
      auVar117._0_8_ = uVar160;
      auVar1 = auVar54 * auVar114 + auVar144 + auVar55 * auVar115 + auVar56 * auVar116 +
               auVar57 * auVar117;
      uVar152 = auVar1._0_8_;
      auVar146._8_8_ = 0;
      auVar146._0_8_ = uVar152 >> 0x34 | auVar1._8_8_ << 0xc;
      auVar118._8_8_ = 0;
      auVar118._0_8_ = (uVar152 & 0xfffffffffffff) << 4 | uStack_f8;
      auVar1 = auVar53 * auVar113 + ZEXT816(0x1000003d1) * auVar118;
      uVar152 = auVar1._0_8_;
      (psVar159->x).n[0] = uVar152 & 0xfffffffffffff;
      auVar145._8_8_ = 0;
      auVar145._0_8_ = uVar152 >> 0x34 | auVar1._8_8_ << 0xc;
      auVar58._8_8_ = 0;
      auVar58._0_8_ = (a_00->x).n[0];
      auVar119._8_8_ = 0;
      auVar119._0_8_ = uVar160;
      auVar59._8_8_ = 0;
      auVar59._0_8_ = (a_00->x).n[1];
      auVar120._8_8_ = 0;
      auVar120._0_8_ = uVar155;
      auVar60._8_8_ = 0;
      auVar60._0_8_ = (a_00->x).n[2];
      auVar121._8_8_ = 0;
      auVar121._0_8_ = uVar153;
      auVar61._8_8_ = 0;
      auVar61._0_8_ = (a_00->x).n[3];
      auVar122._8_8_ = 0;
      auVar122._0_8_ = uVar151;
      auVar62._8_8_ = 0;
      auVar62._0_8_ = (a_00->x).n[4];
      auVar123._8_8_ = 0;
      auVar123._0_8_ = uVar154;
      auVar2 = auVar60 * auVar121 + auVar146 + auVar61 * auVar122 + auVar62 * auVar123;
      uVar152 = auVar2._0_8_;
      auVar63._8_8_ = 0;
      auVar63._0_8_ = uVar152 & 0xfffffffffffff;
      auVar1 = auVar58 * auVar119 + auVar145 + auVar59 * auVar120 + auVar63 * ZEXT816(0x1000003d10);
      uVar156 = auVar1._0_8_;
      auVar148._8_8_ = 0;
      auVar148._0_8_ = uVar152 >> 0x34 | auVar2._8_8_ << 0xc;
      (psVar159->x).n[1] = uVar156 & 0xfffffffffffff;
      auVar147._8_8_ = 0;
      auVar147._0_8_ = uVar156 >> 0x34 | auVar1._8_8_ << 0xc;
      auVar64._8_8_ = 0;
      auVar64._0_8_ = (a_00->x).n[0];
      auVar124._8_8_ = 0;
      auVar124._0_8_ = uVar154;
      auVar65._8_8_ = 0;
      auVar65._0_8_ = (a_00->x).n[1];
      auVar125._8_8_ = 0;
      auVar125._0_8_ = uVar160;
      auVar66._8_8_ = 0;
      auVar66._0_8_ = (a_00->x).n[2];
      auVar126._8_8_ = 0;
      auVar126._0_8_ = uVar155;
      auVar67._8_8_ = 0;
      auVar67._0_8_ = (a_00->x).n[3];
      auVar127._8_8_ = 0;
      auVar127._0_8_ = uVar153;
      auVar68._8_8_ = 0;
      auVar68._0_8_ = (a_00->x).n[4];
      auVar128._8_8_ = 0;
      auVar128._0_8_ = uVar151;
      auVar2 = auVar67 * auVar127 + auVar148 + auVar68 * auVar128;
      uVar155 = auVar2._0_8_;
      auVar69._8_8_ = 0;
      auVar69._0_8_ = uVar155 & 0xfffffffffffff;
      auVar1 = auVar64 * auVar124 + auVar147 + auVar65 * auVar125 + auVar66 * auVar126 +
               auVar69 * ZEXT816(0x1000003d10);
      uVar160 = auVar1._0_8_;
      (psVar159->x).n[2] = uVar160 & 0xfffffffffffff;
      auVar149._8_8_ = 0;
      auVar149._0_8_ = (uVar160 >> 0x34 | auVar1._8_8_ << 0xc) + uStack_e8;
      auVar70._8_8_ = 0;
      auVar70._0_8_ = uVar155 >> 0x34 | auVar2._8_8_ << 0xc;
      auVar149 = auVar70 * ZEXT816(0x1000003d10) + auVar149;
      uVar155 = auVar149._0_8_;
      (psVar159->x).n[3] = uVar155 & 0xfffffffffffff;
      (psVar159->x).n[4] = (uVar155 >> 0x34 | auVar149._8_8_ << 0xc) + uStack_f0;
      (psVar159->x).magnitude = 1;
      (psVar159->x).normalized = 0;
      pcStack_100 = (code *)0x145a7c;
      secp256k1_fe_verify(&psVar159->x);
      return extraout_EAX_00;
    }
  }
  else {
    pcStack_100 = (code *)0x145a90;
    secp256k1_fe_mul_cold_4();
LAB_00145a90:
    pcStack_100 = (code *)0x145a95;
    secp256k1_fe_mul_cold_3();
LAB_00145a95:
    pcStack_100 = (code *)0x145a9a;
    secp256k1_fe_mul_cold_2();
  }
  pcStack_100 = secp256k1_ge_to_storage;
  secp256k1_fe_mul_cold_1();
  a_03 = (secp256k1_ge *)auStack_170;
  psVar157 = a_02;
  psVar159 = a_02;
  psStack_108 = in_RSI;
  pcStack_100 = (code *)unaff_R15;
  secp256k1_ge_verify(a_02);
  if (a_02->infinity == 0) {
    auStack_170._48_8_ = (a_02->x).n[0];
    uStack_138 = (a_02->x).n[1];
    uStack_130 = (a_02->x).n[2];
    uStack_128 = (a_02->x).n[3];
    uStack_120 = (a_02->x).n[4];
    uStack_118._0_4_ = (a_02->x).magnitude;
    iStack_114 = (a_02->x).normalized;
    psVar159 = (secp256k1_ge *)(auStack_170 + 0x30);
    secp256k1_fe_normalize((secp256k1_fe *)psVar159);
    auStack_170._0_8_ = (a_02->y).n[0];
    auStack_170._8_8_ = (a_02->y).n[1];
    auStack_170._16_8_ = (a_02->y).n[2];
    auStack_170._24_8_ = (a_02->y).n[3];
    auStack_170._32_8_ = (a_02->y).n[4];
    auStack_170._40_4_ = (a_02->y).magnitude;
    auStack_170._44_4_ = (a_02->y).normalized;
    secp256k1_fe_normalize((secp256k1_fe *)auStack_170);
    secp256k1_fe_verify((secp256k1_fe *)psVar159);
    if (iStack_114 != 0) {
      (psVar158->x).n[0] = uStack_138 << 0x34 | auStack_170._48_8_;
      (psVar158->x).n[1] = uStack_130 << 0x28 | uStack_138 >> 0xc;
      (psVar158->x).n[2] = uStack_128 << 0x1c | uStack_130 >> 0x18;
      (psVar158->x).n[3] = uStack_120 << 0x10 | uStack_128 >> 0x24;
      secp256k1_fe_verify((secp256k1_fe *)auStack_170);
      if (auStack_170._44_4_ != 0) {
        (psVar158->x).n[4] = auStack_170._8_8_ << 0x34 | auStack_170._0_8_;
        uVar155 = auStack_170._16_8_ << 0x28 | (ulong)auStack_170._8_8_ >> 0xc;
        (psVar158->x).magnitude = (int)uVar155;
        (psVar158->x).normalized = (int)(uVar155 >> 0x20);
        (psVar158->y).n[0] = auStack_170._24_8_ << 0x1c | (ulong)auStack_170._16_8_ >> 0x18;
        (psVar158->y).n[1] = auStack_170._32_8_ << 0x10 | (ulong)auStack_170._24_8_ >> 0x24;
        return SUB84(auStack_170._24_8_,4) >> 4;
      }
      goto LAB_00145bf1;
    }
  }
  else {
    secp256k1_ge_to_storage_cold_1();
  }
  a_03 = psVar159;
  secp256k1_ge_to_storage_cold_3();
LAB_00145bf1:
  secp256k1_ge_to_storage_cold_2();
  (a_03->x).n[0] = (psVar157->x).n[0] & 0xfffffffffffff;
  (a_03->x).n[1] = ((psVar157->x).n[1] & 0xffffffffff) << 0xc | (psVar157->x).n[0] >> 0x34;
  (a_03->x).n[2] = ((psVar157->x).n[2] & 0xfffffff) << 0x18 | (psVar157->x).n[1] >> 0x28;
  (a_03->x).n[3] = ((psVar157->x).n[3] & 0xffff) << 0x24 | (psVar157->x).n[2] >> 0x1c;
  (a_03->x).n[4] = (psVar157->x).n[3] >> 0x10;
  (a_03->x).magnitude = 1;
  (a_03->x).normalized = 1;
  secp256k1_fe_verify(&a_03->x);
  (a_03->y).n[0] = (psVar157->x).n[4] & 0xfffffffffffff;
  uVar155._0_4_ = (psVar157->x).magnitude;
  uVar155._4_4_ = (psVar157->x).normalized;
  (a_03->y).n[1] = (uVar155 & 0xffffffffff) << 0xc | (psVar157->x).n[4] >> 0x34;
  uVar160._0_4_ = (psVar157->x).magnitude;
  uVar160._4_4_ = (psVar157->x).normalized;
  (a_03->y).n[2] = ((psVar157->y).n[0] & 0xfffffff) << 0x18 | uVar160 >> 0x28;
  (a_03->y).n[3] = ((psVar157->y).n[1] & 0xffff) << 0x24 | (psVar157->y).n[0] >> 0x1c;
  (a_03->y).n[4] = (psVar157->y).n[1] >> 0x10;
  (a_03->y).magnitude = 1;
  (a_03->y).normalized = 1;
  secp256k1_fe_verify(&a_03->y);
  a_03->infinity = 0;
  secp256k1_ge_verify(a_03);
  return extraout_EAX_01;
}

Assistant:

static int secp256k1_ge_is_valid_var(const secp256k1_ge *a) {
    secp256k1_fe y2, x3;
    secp256k1_ge_verify(a);
    if (a->infinity) {
        return 0;
    }
    /* y^2 = x^3 + 7 */
    secp256k1_fe_sqr(&y2, &a->y);
    secp256k1_fe_sqr(&x3, &a->x); secp256k1_fe_mul(&x3, &x3, &a->x);
    secp256k1_fe_add_int(&x3, SECP256K1_B);
    return secp256k1_fe_equal_var(&y2, &x3);
}